

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

BuiltinFunction *
math_function(BuiltinFunction *__return_storage_ptr__,string *name,_func_double_double *fun)

{
  pointer pcVar1;
  string *psVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  _func_double_double *local_28;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    ).
    super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           ).
           super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           .
           super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
           .
           super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
           ._M_head_impl.super__Function_base._M_functor + 8) = 0;
  local_28 = fun;
  psVar2 = (string *)operator_new(0x28);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_48,local_40 + (long)local_48);
  *(_func_double_double **)(psVar2 + 0x20) = local_28;
  *(string **)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    ).
    super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
    .
    super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
    ._M_head_impl.super__Function_base._M_functor = psVar2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl._M_invoker =
       std::
       _Function_handler<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/std/builtins/math.cpp:36:19)>
       ::_M_invoke;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Tuple_impl<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .
  super__Head_base<2UL,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>,_false>
  ._M_head_impl.super__Function_base._M_manager =
       std::
       _Function_handler<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/std/builtins/math.cpp:36:19)>
       ::_M_manager;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).
  super__Tuple_impl<1UL,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  .super__Head_base<1UL,_long_long,_false>._M_head_impl = 1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ).super__Head_base<0UL,_long_long,_false>._M_head_impl = 1;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

BuiltinFunction math_function(const std::string &name, double (*fun)(double))
{
    return {1, 1, [name, fun](const std::list<std::shared_ptr<SchemeObject>> &l) {
        double arg = get_value(l.front(), name + ": number required");
        return to_object(std::make_shared<SchemeFloat>(fun(arg)));
    }};
}